

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void linker_init(GlobalVars *gv)

{
  void *pvVar1;
  long in_RDI;
  
  initlist((list *)(in_RDI + 0x138));
  initlist((list *)(in_RDI + 0x150));
  initlist((list *)(in_RDI + 0x168));
  initlist((list *)(in_RDI + 0x180));
  pvVar1 = alloc_hashtable(0x10dcff);
  *(void **)(in_RDI + 0x198) = pvVar1;
  initlist((list *)(in_RDI + 0x1c0));
  initlist((list *)(in_RDI + 0x1a8));
  *(char **)(in_RDI + 0x248) = "__GLOBAL_OFFSET_TABLE_";
  *(char **)(in_RDI + 0x250) = "__PROCEDURE_LINKAGE_TABLE_";
  if (*(char *)(in_RDI + 0x7a) == '\0') {
    *(uint8_t *)(in_RDI + 0x7a) = fff[*(byte *)(in_RDI + 0x58)]->rtab_format;
  }
  else if ((fff[*(byte *)(in_RDI + 0x58)]->rtab_mask & *(byte *)(in_RDI + 0x7a)) == 0) {
    error(0x7a,fff[*(byte *)(in_RDI + 0x58)]->tname);
    *(uint8_t *)(in_RDI + 0x7a) = fff[*(byte *)(in_RDI + 0x58)]->rtab_format;
  }
  return;
}

Assistant:

void linker_init(struct GlobalVars *gv)
{
  initlist(&gv->linkfiles);
  initlist(&gv->selobjects);
  initlist(&gv->libobjects);
  initlist(&gv->sharedobjects);
  gv->symbols = alloc_hashtable(SYMHTABSIZE);
  initlist(&gv->pripointers);
  initlist(&gv->scriptsymbols);
  gv->got_base_name = gotbase_name;
  gv->plt_base_name = pltbase_name;

  if (gv->reloctab_format != RTAB_UNDEF) {
    if (!(fff[gv->dest_format]->rtab_mask & gv->reloctab_format)) {
      error(122,fff[gv->dest_format]->tname);
      gv->reloctab_format = fff[gv->dest_format]->rtab_format;
    }
  }
  else
    gv->reloctab_format = fff[gv->dest_format]->rtab_format;
}